

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportInstallFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportInstallFileGenerator *this,string *name,string *config)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  mapped_type *this_00;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *this_02;
  reference ppcVar4;
  ostream *poVar5;
  string local_580;
  char local_559;
  string local_558;
  undefined1 local_538 [8];
  string prop_filename;
  cmGeneratorTarget *tgt;
  iterator __end1;
  iterator __begin1;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *__range1;
  mapped_type *prop_files;
  undefined1 local_4d0 [8];
  ostringstream e;
  string local_358 [8];
  string se;
  cmGeneratedFileStream os;
  undefined1 local_c8 [8];
  string fileName;
  undefined1 local_a0 [8];
  string dest;
  undefined1 local_70 [8];
  string filename_config;
  undefined1 local_48 [8];
  string cxx_modules_dirname;
  string *config_local;
  string *name_local;
  cmExportInstallFileGenerator *this_local;
  
  cxx_modules_dirname.field_2._8_8_ = config;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])(local_48);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)local_70,(string *)cxx_modules_dirname.field_2._8_8_);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_70,"noconfig");
    }
    fileName.field_2._M_local_buf[0xf] = '/';
    fileName.field_2._M_local_buf[0xe] = '/';
    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char>
              ((string *)local_a0,&(this->super_cmExportFileGenerator).FileDir,
               fileName.field_2._M_local_buf + 0xf,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               fileName.field_2._M_local_buf + 0xe);
    os._615_1_ = 0x2d;
    cmStrCat<std::__cxx11::string_const&,char_const(&)[13],std::__cxx11::string_const&,char,std::__cxx11::string&,char_const(&)[7]>
              ((string *)local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
               (char (*) [13])0x1176d22,name,&os.field_0x267,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               (char (*) [7])0x1137ee7);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)((long)&se.field_2 + 8),(string *)local_c8,true,None);
    bVar1 = std::ios::operator!((ios *)((long)&se.field_2 + *(long *)(se.field_2._8_8_ + -0x18) + 8)
                               );
    if ((bVar1 & 1) == 0) {
      cmGeneratedFileStream::SetCopyIfDifferent
                ((cmGeneratedFileStream *)((long)&se.field_2 + 8),true);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->ConfigCxxModuleFiles,
                             (key_type *)cxx_modules_dirname.field_2._8_8_);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_c8);
      this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->ConfigCxxModuleTargetFiles,
                             (key_type *)cxx_modules_dirname.field_2._8_8_);
      this_02 = &(this->super_cmExportFileGenerator).ExportedTargets;
      __end1 = std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::begin(this_02);
      tgt = (cmGeneratorTarget *)
            std::
            set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
            ::end(this_02);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&tgt), bVar2) {
        ppcVar4 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&__end1);
        prop_filename.field_2._8_8_ = *ppcVar4;
        bVar2 = cmGeneratorTarget::HaveCxx20ModuleSources
                          ((cmGeneratorTarget *)prop_filename.field_2._8_8_,(string *)0x0);
        if (bVar2) {
          cmGeneratorTarget::GetExportName_abi_cxx11_
                    (&local_558,(cmGeneratorTarget *)prop_filename.field_2._8_8_);
          local_559 = '-';
          cmStrCat<char_const(&)[8],std::__cxx11::string,char,std::__cxx11::string&,char_const(&)[7]>
                    ((string *)local_538,(char (*) [8])0x115ad19,&local_558,&local_559,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (char (*) [7])0x1137ee7);
          std::__cxx11::string::~string((string *)&local_558);
          cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&>
                    (&local_580,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538)
          ;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(this_01,&local_580);
          std::__cxx11::string::~string((string *)&local_580);
          poVar5 = std::operator<<((ostream *)((long)&se.field_2 + 8),
                                   "include(\"${CMAKE_CURRENT_LIST_DIR}/");
          poVar5 = std::operator<<(poVar5,(string *)local_538);
          std::operator<<(poVar5,"\")\n");
          std::__cxx11::string::~string((string *)local_538);
        }
        std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&__end1);
      }
      this_local._7_1_ = true;
      filename_config.field_2._12_4_ = 1;
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
      poVar5 = std::operator<<((ostream *)local_4d0,"cannot write to file \"");
      poVar5 = std::operator<<(poVar5,(string *)local_c8);
      poVar5 = std::operator<<(poVar5,"\": ");
      std::operator<<(poVar5,local_358);
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error((string *)&prop_files);
      std::__cxx11::string::~string((string *)&prop_files);
      this_local._7_1_ = false;
      filename_config.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
      std::__cxx11::string::~string(local_358);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)((long)&se.field_2 + 8));
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
    this_local._7_1_ = true;
    filename_config.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmExportInstallFileGenerator::
  GenerateImportCxxModuleConfigTargetInclusion(std::string const& name,
                                               std::string const& config)
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  std::string filename_config = config;
  if (filename_config.empty()) {
    filename_config = "noconfig";
  }

  std::string const dest =
    cmStrCat(this->FileDir, '/', cxx_modules_dirname, '/');
  std::string fileName =
    cmStrCat(dest, "cxx-modules-", name, '-', filename_config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  // Record this per-config import file.
  this->ConfigCxxModuleFiles[config] = fileName;

  auto& prop_files = this->ConfigCxxModuleTargetFiles[config];
  for (auto const* tgt : this->ExportedTargets) {
    // Only targets with C++ module sources will have a
    // collator-generated install script.
    if (!tgt->HaveCxx20ModuleSources()) {
      continue;
    }

    auto prop_filename = cmStrCat("target-", tgt->GetExportName(), '-',
                                  filename_config, ".cmake");
    prop_files.emplace_back(cmStrCat(dest, prop_filename));
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/" << prop_filename << "\")\n";
  }

  return true;
}